

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucptrie.cpp
# Opt level: O0

uint32_t anon_unknown.dwarf_235225::getValue
                   (UCPTrieData data,UCPTrieValueWidth valueWidth,int32_t dataIndex)

{
  int32_t dataIndex_local;
  UCPTrieValueWidth valueWidth_local;
  UCPTrieData data_local;
  
  if (valueWidth == UCPTRIE_VALUE_BITS_16) {
    data_local._4_4_ = ZEXT24(*(ushort *)((long)data.ptr0 + (long)dataIndex * 2));
  }
  else if (valueWidth == UCPTRIE_VALUE_BITS_32) {
    data_local._4_4_ = *(undefined4 *)((long)data.ptr0 + (long)dataIndex * 4);
  }
  else if (valueWidth == UCPTRIE_VALUE_BITS_8) {
    data_local._4_4_ = ZEXT14(*(byte *)((long)data.ptr0 + (long)dataIndex));
  }
  else {
    data_local._4_4_ = 0xffffffff;
  }
  return data_local._4_4_;
}

Assistant:

inline uint32_t getValue(UCPTrieData data, UCPTrieValueWidth valueWidth, int32_t dataIndex) {
    switch (valueWidth) {
    case UCPTRIE_VALUE_BITS_16:
        return data.ptr16[dataIndex];
    case UCPTRIE_VALUE_BITS_32:
        return data.ptr32[dataIndex];
    case UCPTRIE_VALUE_BITS_8:
        return data.ptr8[dataIndex];
    default:
        // Unreachable if the trie is properly initialized.
        return 0xffffffff;
    }
}